

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.cpp
# Opt level: O2

void __thiscall vera::Pyramid::process(Pyramid *this,Fbo *_input)

{
  function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)> *this_00;
  Fbo *__args;
  uint uVar1;
  ulong uVar2;
  Fbo *__args_2;
  int iVar3;
  Fbo *pFVar4;
  
  this_00 = &this->pass;
  __args = this->m_downs;
  std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
            (this_00,__args,_input,(Fbo *)0x0,0);
  pFVar4 = this->m_downs;
  for (uVar2 = 1; pFVar4 = pFVar4 + 1, uVar1 = this->m_depth, uVar2 < uVar1; uVar2 = uVar2 + 1) {
    std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
              (this_00,pFVar4,pFVar4 + -1,(Fbo *)0x0,(int)uVar2);
  }
  pFVar4 = this->m_ups;
  std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
            (this_00,pFVar4,__args + (uVar1 - 2),__args + (uVar1 - 1),uVar1 - 1);
  uVar2 = 1;
  iVar3 = -3;
  __args_2 = pFVar4;
  while( true ) {
    uVar1 = this->m_depth;
    if (uVar1 - 1 <= uVar2) break;
    std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
              (this_00,__args_2 + 1,__args + (uVar1 + iVar3),__args_2,uVar1 + iVar3 + 1);
    uVar2 = uVar2 + 1;
    iVar3 = iVar3 + -1;
    __args_2 = __args_2 + 1;
  }
  std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
            (this_00,pFVar4 + (uVar1 - 1),_input,pFVar4 + (uVar1 - 2),0);
  return;
}

Assistant:

void Pyramid::process(const vera::Fbo *_input) {
    unsigned int i;
    // Copy the input to the first downscale
    pass(&m_downs[0], _input, NULL, 0);

    // DOWNSCALE
    for (i = 1; i < m_depth; i++)
        pass(&m_downs[i], &(m_downs[i-1]), NULL, i);
    
    // Copy the last downscale to the first upscale
    pass(&m_ups[0], &(m_downs[m_depth-2]), &(m_downs[m_depth-1]), m_depth-1);
    
    // UPSCALE
    for (i = 1; i < m_depth-1; i++)
        pass(&m_ups[i], &(m_downs[m_depth-i-2]), &(m_ups[i-1]), m_depth-1-i);
    
    // Copy the last upscale to the output
    pass(&m_ups[m_depth-1], _input, &(m_ups[m_depth-2]), 0);
}